

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivision_geometry_device.cpp
# Opt level: O3

void embree::renderTileStandard
               (int taskIndex,int threadIndex,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,int numTilesX,int numTilesY)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vec3fa color;
  uint local_6c;
  float local_58;
  float local_54;
  float local_50;
  ulong local_40;
  ulong local_38;
  
  iVar1 = taskIndex / numTilesX;
  local_6c = iVar1 * 8;
  uVar2 = iVar1 * 8 + 8;
  if (uVar2 < height) {
    height = uVar2;
  }
  if (local_6c < height) {
    uVar2 = taskIndex % numTilesX << 3;
    uVar3 = (taskIndex % numTilesX) * 8 + 8;
    uVar4 = (ulong)uVar3;
    if (width <= uVar3) {
      uVar4 = (ulong)width;
    }
    uVar6 = (ulong)(iVar1 * width * 8);
    local_40 = (ulong)width;
    local_38 = uVar4;
    do {
      if (uVar2 < (uint)uVar4) {
        uVar5 = (ulong)uVar2;
        do {
          renderPixelStandard((embree *)&local_58,(float)(uVar5 & 0xffffffff),(float)local_6c,camera
                              ,g_stats + threadIndex);
          fVar7 = local_58;
          if (1.0 <= local_58) {
            fVar7 = 1.0;
          }
          fVar10 = 0.0;
          if (0.0 <= fVar7) {
            fVar10 = fVar7;
          }
          fVar7 = local_54;
          if (1.0 <= local_54) {
            fVar7 = 1.0;
          }
          fVar8 = 0.0;
          if (0.0 <= fVar7) {
            fVar8 = fVar7;
          }
          fVar7 = local_50;
          if (1.0 <= local_50) {
            fVar7 = 1.0;
          }
          fVar9 = 0.0;
          if (0.0 <= fVar7) {
            fVar9 = fVar7;
          }
          pixels[(uint)((int)uVar6 + (int)uVar5)] =
               (int)(long)(fVar8 * 255.0) * 0x100 + (int)(long)(fVar10 * 255.0) +
               (int)(long)(fVar9 * 255.0) * 0x10000;
          uVar5 = uVar5 + 1;
          uVar4 = local_38;
        } while (uVar5 < local_38);
      }
      local_6c = local_6c + 1;
      uVar6 = uVar6 + local_40;
    } while (local_6c != height);
  }
  return;
}

Assistant:

void renderTileStandard(int taskIndex,
                        int threadIndex,
                        int* pixels,
                        const unsigned int width,
                        const unsigned int height,
                        const float time,
                        const ISPCCamera& camera,
                        const int numTilesX,
                        const int numTilesY)
{
  const unsigned int tileY = taskIndex / numTilesX;
  const unsigned int tileX = taskIndex - tileY * numTilesX;
  const unsigned int x0 = tileX * TILE_SIZE_X;
  const unsigned int x1 = min(x0+TILE_SIZE_X,width);
  const unsigned int y0 = tileY * TILE_SIZE_Y;
  const unsigned int y1 = min(y0+TILE_SIZE_Y,height);

  for (unsigned int y=y0; y<y1; y++) for (unsigned int x=x0; x<x1; x++)
  {
    /* calculate pixel color */
    Vec3fa color = renderPixelStandard((float)x,(float)y,camera,g_stats[threadIndex]);

    /* write color to framebuffer */
    unsigned int r = (unsigned int) (255.0f * clamp(color.x,0.0f,1.0f));
    unsigned int g = (unsigned int) (255.0f * clamp(color.y,0.0f,1.0f));
    unsigned int b = (unsigned int) (255.0f * clamp(color.z,0.0f,1.0f));
    pixels[y*width+x] = (b << 16) + (g << 8) + r;
  }
}